

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O3

int testInvalidConcatNdWrongAxis(void)

{
  RepeatedField<long> *pRVar1;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  RepeatedPtrField<CoreML::Specification::Tensor> *this_00;
  uint uVar2;
  ulong uVar3;
  bool bVar4;
  FeatureType *pFVar5;
  long *plVar6;
  FeatureDescription *pFVar7;
  ArrayFeatureType *pAVar8;
  NeuralNetworkLayer *pNVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  Tensor *pTVar11;
  void *pvVar12;
  LayerUnion LVar13;
  ostream *poVar14;
  string *psVar15;
  long lVar16;
  Rep *pRVar17;
  undefined8 *puVar18;
  int iVar19;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar20;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_01;
  Arena *pAVar21;
  uint uVar22;
  Model m;
  Result res;
  Model local_80;
  Result local_50;
  
  CoreML::Specification::Model::Model(&local_80,(Arena *)0x0,false);
  if (local_80.description_ == (ModelDescription *)0x0) {
    pAVar21 = (Arena *)(local_80.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_80.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    local_80.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar21);
  }
  pRVar17 = ((local_80.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar17 == (Rep *)0x0) {
LAB_0018e9b6:
    pRVar20 = &(local_80.description_)->input_;
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((pRVar20->super_RepeatedPtrFieldBase).arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar20->super_RepeatedPtrFieldBase,pFVar7);
  }
  else {
    iVar19 = ((local_80.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar17->allocated_size <= iVar19) goto LAB_0018e9b6;
    ((local_80.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar19 + 1;
    pvVar12 = pRVar17->elements[iVar19];
  }
  puVar18 = (undefined8 *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
    puVar18 = (undefined8 *)*puVar18;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar12 + 0x10),"input",puVar18);
  pFVar5 = *(FeatureType **)((long)pvVar12 + 0x20);
  if (pFVar5 == (FeatureType *)0x0) {
    pAVar21 = (Arena *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pFVar5 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar21);
    *(FeatureType **)((long)pvVar12 + 0x20) = pFVar5;
  }
  if (pFVar5->_oneof_case_[0] == 5) {
    pAVar8 = (pFVar5->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar5);
    pFVar5->_oneof_case_[0] = 5;
    uVar3 = (pFVar5->super_MessageLite)._internal_metadata_.ptr_;
    pAVar21 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar21);
    (pFVar5->Type_).multiarraytype_ = pAVar8;
  }
  pRVar1 = &pAVar8->shape_;
  uVar2 = (pAVar8->shape_).current_size_;
  if (uVar2 == (pAVar8->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar2 + 1);
    plVar6 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar6[uVar2] = 3;
  }
  else {
    plVar6 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar6[uVar2] = 3;
  }
  uVar22 = uVar2 + 1;
  (pAVar8->shape_).current_size_ = uVar22;
  if (uVar22 == (pAVar8->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar2 + 2);
    plVar6 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar6[uVar22] = 5;
  }
  else {
    plVar6 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar6[uVar22] = 5;
  }
  uVar22 = uVar2 + 2;
  (pAVar8->shape_).current_size_ = uVar22;
  if (uVar22 == (pAVar8->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar2 + 3);
    plVar6 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar6[uVar22] = 2;
  }
  else {
    plVar6 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar6[uVar22] = 2;
  }
  pRVar1->current_size_ = uVar2 + 3;
  if (local_80.description_ == (ModelDescription *)0x0) {
    pAVar21 = (Arena *)(local_80.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_80.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    local_80.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar21);
  }
  pRVar17 = ((local_80.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar17 == (Rep *)0x0) {
LAB_0018eb73:
    pRVar20 = &(local_80.description_)->output_;
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((pRVar20->super_RepeatedPtrFieldBase).arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar20->super_RepeatedPtrFieldBase,pFVar7);
  }
  else {
    iVar19 = ((local_80.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar17->allocated_size <= iVar19) goto LAB_0018eb73;
    ((local_80.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar19 + 1;
    pvVar12 = pRVar17->elements[iVar19];
  }
  puVar18 = (undefined8 *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
    puVar18 = (undefined8 *)*puVar18;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar12 + 0x10),"output",puVar18);
  pFVar5 = *(FeatureType **)((long)pvVar12 + 0x20);
  if (pFVar5 == (FeatureType *)0x0) {
    pAVar21 = (Arena *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pFVar5 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar21);
    *(FeatureType **)((long)pvVar12 + 0x20) = pFVar5;
  }
  if (pFVar5->_oneof_case_[0] == 5) {
    pAVar8 = (pFVar5->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar5);
    pFVar5->_oneof_case_[0] = 5;
    uVar3 = (pFVar5->super_MessageLite)._internal_metadata_.ptr_;
    pAVar21 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar21);
    (pFVar5->Type_).multiarraytype_ = pAVar8;
  }
  pRVar1 = &pAVar8->shape_;
  uVar2 = (pAVar8->shape_).current_size_;
  if (uVar2 == (pAVar8->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar2 + 1);
    plVar6 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar6[uVar2] = 3;
  }
  else {
    plVar6 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar6[uVar2] = 3;
  }
  uVar22 = uVar2 + 1;
  (pAVar8->shape_).current_size_ = uVar22;
  if (uVar22 == (pAVar8->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar2 + 2);
    plVar6 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar6[uVar22] = 5;
  }
  else {
    plVar6 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar6[uVar22] = 5;
  }
  uVar22 = uVar2 + 2;
  (pAVar8->shape_).current_size_ = uVar22;
  if (uVar22 == (pAVar8->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar2 + 3);
    plVar6 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar6[uVar22] = 1;
  }
  else {
    plVar6 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar6[uVar22] = 1;
  }
  pRVar1->current_size_ = uVar2 + 3;
  if (local_80._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_80);
    local_80._oneof_case_[0] = 500;
    pAVar21 = (Arena *)(local_80.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_80.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    local_80.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar21);
  }
  (local_80.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  pRVar17 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
             &(local_80.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar17 == (Rep *)0x0) {
LAB_0018ed50:
    this_01 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
              &(local_80.Type_.pipeline_)->models_;
    pNVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                       ((this_01->super_RepeatedPtrFieldBase).arena_);
    pNVar9 = (NeuralNetworkLayer *)
             google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                       ((RepeatedPtrFieldBase *)this_01,pNVar9);
  }
  else {
    iVar19 = (local_80.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar17->allocated_size <= iVar19) goto LAB_0018ed50;
    (local_80.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar19 + 1;
    pNVar9 = (NeuralNetworkLayer *)pRVar17->elements[iVar19];
  }
  this = &pNVar9->input_;
  pRVar17 = (pNVar9->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar17 == (Rep *)0x0) {
LAB_0018ed8c:
    pbVar10 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((this->super_RepeatedPtrFieldBase).arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&this->super_RepeatedPtrFieldBase,pbVar10);
  }
  else {
    iVar19 = (pNVar9->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar17->allocated_size <= iVar19) goto LAB_0018ed8c;
    (pNVar9->input_).super_RepeatedPtrFieldBase.current_size_ = iVar19 + 1;
    pvVar12 = pRVar17->elements[iVar19];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar12,0,*(char **)((long)pvVar12 + 8),0x3975b6);
  pRVar17 = (pNVar9->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar17 == (Rep *)0x0) {
LAB_0018edd8:
    pbVar10 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((this->super_RepeatedPtrFieldBase).arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&this->super_RepeatedPtrFieldBase,pbVar10);
  }
  else {
    iVar19 = (pNVar9->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar17->allocated_size <= iVar19) goto LAB_0018edd8;
    (pNVar9->input_).super_RepeatedPtrFieldBase.current_size_ = iVar19 + 1;
    pvVar12 = pRVar17->elements[iVar19];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar12,0,*(char **)((long)pvVar12 + 8),0x3975bd);
  pRVar17 = (pNVar9->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar17 == (Rep *)0x0) {
LAB_0018ee24:
    pbVar10 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar9->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar9->output_).super_RepeatedPtrFieldBase,pbVar10);
  }
  else {
    iVar19 = (pNVar9->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar17->allocated_size <= iVar19) goto LAB_0018ee24;
    (pNVar9->output_).super_RepeatedPtrFieldBase.current_size_ = iVar19 + 1;
    pvVar12 = pRVar17->elements[iVar19];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar12,0,*(char **)((long)pvVar12 + 8),0x3bbdaf);
  this_00 = &pNVar9->inputtensor_;
  pRVar17 = (pNVar9->inputtensor_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar17 == (Rep *)0x0) {
LAB_0018ee7f:
    pTVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Tensor>
                        ((this_00->super_RepeatedPtrFieldBase).arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&this_00->super_RepeatedPtrFieldBase,pTVar11);
    pRVar17 = (pNVar9->inputtensor_).super_RepeatedPtrFieldBase.rep_;
    *(undefined4 *)((long)pvVar12 + 0x24) = 3;
    if (pRVar17 != (Rep *)0x0) goto LAB_0018eea2;
LAB_0018eeb7:
    pTVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Tensor>
                        ((this_00->super_RepeatedPtrFieldBase).arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&this_00->super_RepeatedPtrFieldBase,pTVar11);
  }
  else {
    iVar19 = (pNVar9->inputtensor_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar17->allocated_size <= iVar19) goto LAB_0018ee7f;
    (pNVar9->inputtensor_).super_RepeatedPtrFieldBase.current_size_ = iVar19 + 1;
    *(undefined4 *)((long)pRVar17->elements[iVar19] + 0x24) = 3;
LAB_0018eea2:
    iVar19 = (pNVar9->inputtensor_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar17->allocated_size <= iVar19) goto LAB_0018eeb7;
    (pNVar9->inputtensor_).super_RepeatedPtrFieldBase.current_size_ = iVar19 + 1;
    pvVar12 = pRVar17->elements[iVar19];
  }
  *(undefined4 *)((long)pvVar12 + 0x24) = 3;
  if (pNVar9->_oneof_case_[0] == 0x3d4) {
    LVar13 = pNVar9->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar9);
    pNVar9->_oneof_case_[0] = 0x3d4;
    uVar3 = (pNVar9->super_MessageLite)._internal_metadata_.ptr_;
    pAVar21 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    LVar13.concatnd_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ConcatNDLayerParams>
                   (pAVar21);
    (pNVar9->layer_).concatnd_ = (ConcatNDLayerParams *)LVar13;
  }
  (LVar13.activation_)->NonlinearityType_ = (NonlinearityTypeUnion)0xfffffffffffffffc;
  CoreML::validate<(MLModelType)500>(&local_50,&local_80);
  bVar4 = CoreML::Result::good(&local_50);
  if (bVar4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x13f5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
  }
  else {
    psVar15 = CoreML::Result::message_abi_cxx11_(&local_50);
    iVar19 = 0;
    lVar16 = std::__cxx11::string::find((char *)psVar15,0x397d10,0);
    if (lVar16 != -1) goto LAB_0018f0b1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x13f6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,"res.message().find(\"axis\") != std::string::npos",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
  }
  std::ostream::put((char)poVar14);
  iVar19 = 1;
  std::ostream::flush();
LAB_0018f0b1:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.m_message._M_dataplus._M_p != &local_50.m_message.field_2) {
    operator_delete(local_50.m_message._M_dataplus._M_p,
                    local_50.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_80);
  return iVar19;
}

Assistant:

int testInvalidConcatNdWrongAxis() {

    Specification::Model m;

    auto *in = m.mutable_description()->add_input();
    in->set_name("input");
    auto *inShape = in->mutable_type()->mutable_multiarraytype();
    inShape->add_shape(3);
    inShape->add_shape(5);
    inShape->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(1);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input1");
    layers->add_input("input2");
    layers->add_output("output");
    layers->add_inputtensor()->set_rank(3);
    layers->add_inputtensor()->set_rank(3);

    auto *params = layers->mutable_concatnd();
    params->set_axis(-4);

    // axis should be in range [-rank, rank)
    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    ML_ASSERT(res.message().find("axis") != std::string::npos);

    return 0;

}